

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

string * __thiscall
QPDFArgParser::getProgname_abi_cxx11_(string *__return_storage_ptr__,QPDFArgParser *this)

{
  element_type *peVar1;
  QPDFArgParser *this_local;
  
  peVar1 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&peVar1->whoami);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFArgParser::getProgname()
{
    return m->whoami;
}